

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

int pageant_reencrypt_all_keys(char **retstr)

{
  uint uVar1;
  PageantClientOp *pco;
  unsigned_long uVar2;
  char *pcVar3;
  int iVar4;
  ptrlen pl;
  
  pco = pageant_client_op_new();
  BinarySink_put_byte(pco->binarysink_,'\x1b');
  pl.len = 0x29;
  pl.ptr = "reencrypt-all@putty.projects.tartarus.org";
  BinarySink_put_stringpl(pco->binarysink_,pl);
  uVar1 = pageant_client_op_query(pco);
  uVar2 = BinarySource_get_uint32(pco->binarysource_);
  pageant_client_op_free(pco);
  if (uVar1 == 5) {
    pcVar3 = "Agent doesn\'t support encrypted keys";
  }
  else {
    if (uVar1 == 6) {
      if ((int)uVar2 == 0) {
        pcVar3 = (char *)0x0;
        iVar4 = 0;
      }
      else {
        if ((int)uVar2 == 1) {
          pcVar3 = dupstr("1 key remains unencrypted");
        }
        else {
          pcVar3 = dupprintf("%u keys remain unencrypted",uVar2 & 0xffffffff);
        }
        iVar4 = 3;
      }
      goto LAB_001154a6;
    }
    pcVar3 = "Agent failed to re-encrypt any keys";
  }
  pcVar3 = dupstr(pcVar3);
  iVar4 = 1;
LAB_001154a6:
  *retstr = pcVar3;
  return iVar4;
}

Assistant:

int pageant_reencrypt_all_keys(char **retstr)
{
    PageantClientOp *pco = pageant_client_op_new();
    put_byte(pco, SSH2_AGENTC_EXTENSION);
    put_stringpl(pco, extension_names[EXT_REENCRYPT_ALL]);
    unsigned reply = pageant_client_op_query(pco);
    uint32_t failures = get_uint32(pco);
    pageant_client_op_free(pco);
    if (reply != SSH_AGENT_SUCCESS) {
        if (reply == SSH_AGENT_FAILURE) {
            /* The agent didn't understand the protocol extension at all. */
            *retstr = dupstr("Agent doesn't support encrypted keys");
        } else {
            *retstr = dupstr("Agent failed to re-encrypt any keys");
        }
        return PAGEANT_ACTION_FAILURE;
    } else if (failures == 1) {
        /* special case for English grammar */
        *retstr = dupstr("1 key remains unencrypted");
        return PAGEANT_ACTION_WARNING;
    } else if (failures > 0) {
        *retstr = dupprintf("%"PRIu32" keys remain unencrypted", failures);
        return PAGEANT_ACTION_WARNING;
    } else {
        *retstr = NULL;
        return PAGEANT_ACTION_OK;
    }
}